

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void EncloseBlockText(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  uint uVar3;
  Bool BVar4;
  Node *element;
  Node **ppNVar5;
  Node *node_00;
  
  if (node != (Node *)0x0) {
    do {
      while( true ) {
        pNVar1 = node->next;
        if (node->content != (Node *)0x0) {
          EncloseBlockText(doc,node->content);
        }
        if (((((node->tag == (Dict *)0x0) ||
              (uVar3 = node->tag->id - TidyTag_BLOCKQUOTE, 0x3c < uVar3)) ||
             ((0x1000000000400001U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) ||
            (node_00 = node->content, node_00 == (Node *)0x0)) ||
           (((BVar4 = prvTidynodeIsText(node_00), BVar4 == no ||
             (BVar4 = prvTidyIsBlank(doc->lexer,node_00), BVar4 != no)) &&
            ((BVar4 = prvTidynodeIsElement(node_00), BVar4 == no ||
             (BVar4 = nodeCMIsOnlyInline(node_00), BVar4 == no)))))) break;
        element = prvTidyInferredTag(doc,TidyTag_P);
        pNVar1 = node_00->parent;
        element->parent = pNVar1;
        element->next = node_00;
        element->prev = node_00->prev;
        node_00->prev = element;
        if (element->prev != (Node *)0x0) {
          element->prev->next = element;
        }
        if (pNVar1->content == node_00) {
          pNVar1->content = element;
        }
        do {
          BVar4 = prvTidynodeIsElement(node_00);
          if ((BVar4 != no) && (BVar4 = nodeCMIsOnlyInline(node_00), BVar4 == no)) break;
          pNVar1 = node_00->next;
          prvTidyRemoveNode(node_00);
          node_00->parent = element;
          pNVar2 = element->last;
          node_00->prev = pNVar2;
          ppNVar5 = &pNVar2->next;
          if (pNVar2 == (Node *)0x0) {
            ppNVar5 = &element->content;
          }
          *ppNVar5 = node_00;
          element->last = node_00;
          node_00 = pNVar1;
        } while (pNVar1 != (Node *)0x0);
        TrimSpaces(doc,element);
      }
      node = pNVar1;
    } while (pNVar1 != (Node *)0x0);
  }
  return;
}

Assistant:

static void EncloseBlockText(TidyDocImpl* doc, Node* node)
{
    Node *next;
    Node *block;

    while (node)
    {
        next = node->next;

        if (node->content)
            EncloseBlockText(doc, node->content);

        if (!(nodeIsFORM(node) || nodeIsNOSCRIPT(node) ||
              nodeIsBLOCKQUOTE(node))
            || !node->content)
        {
            node = next;
            continue;
        }

        block = node->content;

        if ((TY_(nodeIsText)(block) && !TY_(IsBlank)(doc->lexer, block)) ||
            (TY_(nodeIsElement)(block) && nodeCMIsOnlyInline(block)))
        {
            Node* p = TY_(InferredTag)(doc, TidyTag_P);
            TY_(InsertNodeBeforeElement)(block, p);
            while (block &&
                   (!TY_(nodeIsElement)(block) || nodeCMIsOnlyInline(block)))
            {
                Node* tempNext = block->next;
                TY_(RemoveNode)(block);
                TY_(InsertNodeAtEnd)(p, block);
                block = tempNext;
            }
            TrimSpaces(doc, p);
            continue;
        }

        node = next;
    }
}